

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

UBool ucnv_io_cleanup(void)

{
  if (gAliasData != (UDataMemory *)0x0) {
    udata_close_63(gAliasData);
    gAliasData = (UDataMemory *)0x0;
  }
  icu_63::UInitOnce::reset(&gAliasDataInitOnce);
  memset(&gMainTable,0,0x70);
  return '\x01';
}

Assistant:

static UBool U_CALLCONV ucnv_io_cleanup(void)
{
    if (gAliasData) {
        udata_close(gAliasData);
        gAliasData = NULL;
    }
    gAliasDataInitOnce.reset();

    uprv_memset(&gMainTable, 0, sizeof(gMainTable));

    return TRUE;                   /* Everything was cleaned up */
}